

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleMenuItem::child(QAccessibleMenuItem *this,int index)

{
  long lVar1;
  QObject *pQVar2;
  QAccessibleInterface *pQVar3;
  
  if (index == 0) {
    QAction::menuObject();
    lVar1 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (lVar1 != 0) {
      QAction::menuObject();
      pQVar2 = (QObject *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      pQVar3 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar2);
      return pQVar3;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleMenuItem::child(int index) const
{
    if (index == 0 && action()->menu())
        return QAccessible::queryAccessibleInterface(action()->menu());
    return nullptr;
}